

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O3

void __thiscall nv::DirectDrawSurface::DirectDrawSurface(DirectDrawSurface *this,char *name)

{
  int iVar1;
  Stream *this_00;
  
  this_00 = (Stream *)operator_new(0x20);
  StdInputStream::StdInputStream((StdInputStream *)this_00,name);
  this->stream = this_00;
  (this->header).fourcc = 0x20534444;
  (this->header).size = 0x7c;
  (this->header).flags = 0x1001;
  (this->header).height = 0;
  (this->header).width = 0;
  (this->header).pitch = 0;
  (this->header).depth = 0;
  (this->header).mipmapcount = 0;
  (this->header).reserved[0] = 0;
  (this->header).reserved[1] = 0;
  (this->header).reserved[2] = 0;
  (this->header).reserved[3] = 0;
  (this->header).reserved[4] = 0;
  (this->header).reserved[5] = 0;
  (this->header).reserved[6] = 0;
  (this->header).reserved[7] = 0;
  (this->header).reserved[8] = 0;
  (this->header).reserved[9] = 0x5454564e;
  (this->header).reserved[10] = 0x20008;
  (this->header).pf.size = 0x20;
  (this->header).pf.flags = 0;
  (this->header).pf.fourcc = 0;
  (this->header).pf.bitcount = 0;
  (this->header).pf.rmask = 0;
  (this->header).pf.rmask = 0;
  (this->header).pf.gmask = 0;
  (this->header).pf.bmask = 0;
  (this->header).pf.amask = 0;
  (this->header).caps.caps1 = 0x1000;
  (this->header).caps.caps2 = 0;
  (this->header).caps.caps3 = 0;
  *(undefined8 *)&(this->header).caps.caps4 = 0;
  (this->header).header10.dxgiFormat = 0;
  (this->header).header10.resourceDimension = 0;
  (this->header).header10.miscFlag = 0;
  (this->header).header10.arraySize = 0;
  (this->header).header10.reserved = 0;
  iVar1 = (*(((StdStream *)&this_00->_vptr_Stream)->super_Stream)._vptr_Stream[6])(this_00);
  if ((char)iVar1 != '\0') {
    return;
  }
  operator<<(this->stream,&this->header);
  return;
}

Assistant:

DirectDrawSurface::DirectDrawSurface(const char * name) : stream(new StdInputStream(name))
{
	if (!stream->isError())
	{
		(*stream) << header;
	}
}